

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

RealType __thiscall OpenMD::Snapshot::getYZarea(Snapshot *this)

{
  RealType RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint i;
  double *pdVar7;
  long lVar8;
  double tmp;
  double dVar9;
  Vector<double,_3U> v;
  double local_28 [4];
  
  if (this->hasYZarea == true) {
    RVar1 = (this->frameData).yzArea;
  }
  else {
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    pdVar7 = (this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
             data_[0] + 1;
    lVar8 = 0;
    do {
      local_28[lVar8] = *pdVar7;
      dVar6 = local_28[2];
      dVar5 = local_28[1];
      dVar3 = local_28[0];
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar8 != 3);
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    pdVar7 = (this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
             data_[0] + 2;
    lVar8 = 0;
    do {
      local_28[lVar8] = *pdVar7;
      dVar4 = local_28[0];
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar8 != 3);
    dVar2 = dVar3 * local_28[1];
    dVar9 = local_28[0] * dVar6;
    local_28[0] = local_28[2] * dVar5 - dVar6 * local_28[1];
    local_28[1] = dVar9 - dVar3 * local_28[2];
    local_28[2] = dVar2 - dVar4 * dVar5;
    dVar3 = 0.0;
    lVar8 = 0;
    do {
      dVar3 = dVar3 + local_28[lVar8] * local_28[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar3 < 0.0) {
      RVar1 = sqrt(dVar3);
    }
    else {
      RVar1 = SQRT(dVar3);
    }
    (this->frameData).yzArea = RVar1;
    this->hasYZarea = true;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getYZarea() {
    if (!hasYZarea) {
      Vector3d y       = frameData.hmat.getColumn(1);
      Vector3d z       = frameData.hmat.getColumn(2);
      frameData.yzArea = cross(y, z).length();
      hasYZarea        = true;
    }
    return frameData.yzArea;
  }